

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::DisjunctionPass1
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  long lVar1;
  code *pcVar2;
  EncodedChar EVar3;
  bool bVar4;
  AltNode *pAVar5;
  undefined4 *puVar6;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar7;
  AltNode *pAVar8;
  AltNode *local_100;
  AltNode *local_f8;
  TrackAllocData local_d8;
  code *local_b0;
  undefined8 local_a8;
  TrackAllocData local_a0;
  AltNode *local_78;
  AltNode *cons;
  undefined8 local_68;
  TrackAllocData local_60;
  AltNode *local_38;
  AltNode *nextList;
  Node *revisedPrev;
  Node *next;
  AltNode *last;
  Node *node;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  node = (Node *)this;
  pAVar5 = (AltNode *)AlternativePass1(this);
  next = (Node *)0x0;
  pAVar8 = pAVar5;
  if ((pAVar5->super_Node).tag == Alt) {
    while (next = &pAVar8->super_Node, lVar1._0_2_ = next[1].tag, lVar1._2_2_ = next[1].features,
          lVar1._4_4_ = *(undefined4 *)&next[1].field_0xc, lVar1 != 0) {
      pAVar8 = (AltNode *)*(Node **)&next[1].tag;
    }
  }
  do {
    while( true ) {
      while( true ) {
        last = pAVar5;
        EVar3 = ECLookahead(this,0);
        if (EVar3 != '|') {
          return &last->super_Node;
        }
        ECConsume(this,1);
        revisedPrev = AlternativePass1(this);
        if (revisedPrev == (Node *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x2ea,"(next != nullptr)","next != nullptr");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        if (next == (Node *)0x0) {
          local_f8 = last;
        }
        else {
          local_f8 = (AltNode *)next[1]._vptr_Node;
        }
        nextList = (AltNode *)UnionNodes(this,&local_f8->super_Node,revisedPrev);
        if (nextList == (AltNode *)0x0) break;
        pAVar5 = nextList;
        if (next != (Node *)0x0) {
          next[1]._vptr_Node = (_func_int **)nextList;
          pAVar5 = last;
        }
      }
      if (revisedPrev->tag == Alt) break;
      pAVar7 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_a0,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x311);
      pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar7,&local_a0);
      local_b0 = Memory::ArenaAllocator::Alloc;
      local_a8 = 0;
      pAVar8 = (AltNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar7,0x3f67b0);
      AltNode::AltNode(pAVar8,revisedPrev,(AltNode *)0x0);
      local_78 = pAVar8;
      if (next == (Node *)0x0) {
        pAVar7 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_d8,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x313);
        pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar7,&local_d8);
        pAVar8 = (AltNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar7,0x3f67b0);
        AltNode::AltNode(pAVar8,&last->super_Node,local_78);
        last = pAVar8;
      }
      else {
        *(AltNode **)&next[1].tag = pAVar8;
      }
      next = &local_78->super_Node;
      pAVar5 = last;
    }
    local_38 = (AltNode *)revisedPrev;
    if (revisedPrev == (Node *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x2f9,"(nextList != nullptr)","nextList != nullptr");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (next == (Node *)0x0) {
      local_100 = last;
    }
    else {
      local_100 = (AltNode *)next[1]._vptr_Node;
    }
    nextList = (AltNode *)UnionNodes(this,&local_100->super_Node,local_38->head);
    if (nextList != (AltNode *)0x0) {
      pAVar8 = nextList;
      if (next != (Node *)0x0) {
        next[1]._vptr_Node = (_func_int **)nextList;
        pAVar8 = last;
      }
      last = pAVar8;
      local_38 = local_38->tail;
    }
    if (next == (Node *)0x0) {
      pAVar7 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_60,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x306);
      pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar7,&local_60);
      cons = (AltNode *)Memory::ArenaAllocator::Alloc;
      local_68 = 0;
      pAVar8 = (AltNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar7,0x3f67b0);
      AltNode::AltNode(pAVar8,&last->super_Node,local_38);
      last = pAVar8;
    }
    else {
      *(AltNode **)&next[1].tag = local_38;
    }
    if (local_38 == (AltNode *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x309,"(nextList != nullptr)","nextList != nullptr");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    for (; local_38->tail != (AltNode *)0x0; local_38 = local_38->tail) {
    }
    next = &local_38->super_Node;
    pAVar5 = last;
  } while( true );
}

Assistant:

Node* Parser<P, IsLiteral>::DisjunctionPass1()
    {
        // Maintain the invariants:
        //  - alt lists have two or more items
        //  - alt list items are never alt lists (so we must inline them)
        //  - an alt list never contains two consecutive match-character/match-set nodes
        //    (so we must union consecutive items into a single set)
        Node* node = AlternativePass1();
        AltNode* last = 0;
        // First node may be an alternative
        if (node->tag == Node::Alt)
        {
            last = (AltNode*)node;
            while (last->tail != 0)
                last = last->tail;
        }
        while (true)
        {
            // Could be terminating 0
            if (ECLookahead() != '|')
                return node;
            ECConsume(); // '|'
            Node* next = AlternativePass1();
            AnalysisAssert(next != nullptr);
            Node* revisedPrev = UnionNodes(last == 0 ? node : last->head, next);
            if (revisedPrev != 0)
            {
                // Can merge next into previously seen alternative
                if (last == 0)
                    node = revisedPrev;
                else
                    last->head = revisedPrev;
            }
            else if (next->tag == Node::Alt)
            {
                AltNode* nextList = (AltNode*)next;
                // Since we just had to dereference next to get here, we know that nextList
                // can't be nullptr in this case.
                AnalysisAssert(nextList != nullptr);
                // Append inner list to current list
                revisedPrev = UnionNodes(last == 0 ? node : last->head, nextList->head);
                if (revisedPrev != 0)
                {
                    // Can merge head of list into previously seen alternative
                    if (last ==0)
                        node = revisedPrev;
                    else
                        last->head = revisedPrev;
                    nextList = nextList->tail;
                }
                if (last == 0)
                    node = Anew(ctAllocator, AltNode, node, nextList);
                else
                    last->tail = nextList;
                AnalysisAssert(nextList != nullptr);
                while (nextList->tail != 0)
                    nextList = nextList->tail;
                last = nextList;
            }
            else
            {
                // Append node
                AltNode* cons = Anew(ctAllocator, AltNode, next, 0);
                if (last == 0)
                    node = Anew(ctAllocator, AltNode, node, cons);
                else
                    last->tail = cons;
                last = cons;
            }
        }
    }